

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmBinaryReader.cpp
# Opt level: O0

void __thiscall Wasm::WasmBinaryReader::ReadElementSection(WasmBinaryReader *this)

{
  WasmNode initExpr_00;
  bool bVar1;
  uint count;
  uint32 uVar2;
  uint sourceContextId;
  LocalFunctionId functionId;
  Type TVar3;
  Type TVar4;
  uint funcIndex;
  FunctionBody *pFVar5;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar6;
  WasmElementSegment *this_00;
  Type funcType;
  uint32 elem;
  uint32 iElem;
  TrackAllocData local_78;
  WasmElementSegment *local_50;
  WasmElementSegment *eSeg;
  undefined1 auStack_40 [4];
  uint32 numElem;
  WasmNode initExpr;
  uint32 index;
  uint32 i;
  uint32 numSegments;
  uint32 length;
  WasmBinaryReader *this_local;
  
  i = 0;
  _numSegments = this;
  count = LEB128<unsigned_int,32u>(this,&i);
  uVar2 = Limits::GetMaxElementSegments();
  if (uVar2 < count) {
    ThrowDecodingError(this,L"Too many element segments");
  }
  if (count != 0) {
    Js::WebAssemblyModule::AllocateElementSegs(this->m_module,count);
  }
  pFVar5 = GetFunctionBody(this);
  if (pFVar5 == (FunctionBody *)0x0) {
    bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,WasmReaderPhase);
  }
  else {
    pFVar5 = GetFunctionBody(this);
    sourceContextId = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar5);
    pFVar5 = GetFunctionBody(this);
    functionId = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)pFVar5);
    bVar1 = Js::Phases::IsEnabled
                      ((Phases *)&DAT_01ec1678,WasmReaderPhase,sourceContextId,functionId);
  }
  if (bVar1) {
    Output::Print(L"Indirect table element: %u entries",(ulong)count);
    Output::Print(L"\n");
    Output::Flush();
  }
  initExpr.field_1._20_4_ = 0;
  while( true ) {
    if (count <= (uint)initExpr.field_1._20_4_) {
      return;
    }
    initExpr.field_1.brTable.defaultTarget = LEB128<unsigned_int,32u>(this,&i);
    if ((initExpr.field_1.brTable.defaultTarget != 0) ||
       ((bVar1 = Js::WebAssemblyModule::HasTable(this->m_module), !bVar1 &&
        (bVar1 = Js::WebAssemblyModule::HasTableImport(this->m_module), !bVar1)))) break;
    ReadInitExpr((WasmNode *)auStack_40,this,true);
    TVar3 = LEB128<unsigned_int,32u>(this,&i);
    eSeg._4_4_ = TVar3;
    TVar4 = Limits::GetMaxTableSize();
    if ((uint)TVar4 < (uint)TVar3) {
      ThrowDecodingError(this,L"Too many table element");
    }
    pAVar6 = &this->m_alloc->
              super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_78,(type_info *)&WasmElementSegment::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/WasmBinaryReader.cpp"
               ,0x3d3);
    pAVar6 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             TrackAllocInfo(pAVar6,&local_78);
    this_00 = (WasmElementSegment *)
              new<Memory::ArenaAllocator>(0x48,(ArenaAllocator *)pAVar6,0x3f67b0);
    initExpr_00.field_1.block = (WasmBlock)initExpr._0_8_;
    initExpr_00.op = auStack_40._0_2_;
    initExpr_00._2_6_ = stack0xffffffffffffffc2;
    initExpr_00.field_1._8_8_ = initExpr.field_1.block;
    initExpr_00.field_1._16_8_ = initExpr.field_1.brTable.targetTable;
    WasmElementSegment::WasmElementSegment
              (this_00,this->m_alloc,initExpr.field_1.brTable.defaultTarget,initExpr_00,eSeg._4_4_);
    local_50 = this_00;
    for (funcType = ImportThunk; (uint)funcType < (uint)eSeg._4_4_; funcType = funcType + Function)
    {
      funcIndex = LEB128<unsigned_int,32u>(this,&i);
      TVar3 = Js::WebAssemblyModule::GetFunctionIndexType(this->m_module,funcIndex);
      bVar1 = FunctionIndexTypes::CanBeExported(TVar3);
      if (!bVar1) {
        ThrowDecodingError(this,L"Invalid function to insert in the table %u",(ulong)funcIndex);
      }
      WasmElementSegment::AddElement(local_50,funcIndex);
    }
    Js::WebAssemblyModule::SetElementSeg(this->m_module,local_50,initExpr.field_1._20_4_);
    initExpr.field_1._20_4_ = initExpr.field_1._20_4_ + 1;
  }
  ThrowDecodingError(this,L"Unknown table index %d",(ulong)initExpr.field_1.brTable.defaultTarget);
}

Assistant:

void WasmBinaryReader::ReadElementSection()
{
    uint32 length = 0;
    uint32 numSegments = LEB128(length);
    if (numSegments > Limits::GetMaxElementSegments())
    {
        ThrowDecodingError(_u("Too many element segments"));
    }

    if (numSegments > 0)
    {
        m_module->AllocateElementSegs(numSegments);
    }
    TRACE_WASM_DECODER(_u("Indirect table element: %u entries"), numSegments);

    for (uint32 i = 0; i < numSegments; ++i)
    {
        uint32 index = LEB128(length); // Table id
        if (index != 0 || !(m_module->HasTable() || m_module->HasTableImport()))
        {
            ThrowDecodingError(_u("Unknown table index %d"), index); //MVP limitation
        }

        WasmNode initExpr = ReadInitExpr(true);
        uint32 numElem = LEB128(length);

        if (numElem > Limits::GetMaxTableSize())
        {
            ThrowDecodingError(_u("Too many table element"));
        }

        WasmElementSegment* eSeg = Anew(m_alloc, WasmElementSegment, m_alloc, index, initExpr, numElem);

        for (uint32 iElem = 0; iElem < numElem; ++iElem)
        {
            uint32 elem = LEB128(length);
            FunctionIndexTypes::Type funcType = m_module->GetFunctionIndexType(elem);
            if (!FunctionIndexTypes::CanBeExported(funcType))
            {
                ThrowDecodingError(_u("Invalid function to insert in the table %u"), elem);
            }
            eSeg->AddElement(elem);
        }
        m_module->SetElementSeg(eSeg, i);
    }
}